

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_large_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  char *pcVar2;
  Byte *local_90;
  undefined4 local_88;
  Byte *local_78;
  undefined4 local_70;
  long local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_40 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_88 = (undefined4)comprLen;
  local_90 = compr;
  uVar1 = inflateInit_(&local_90,"1.2.8",0x70);
  if (uVar1 == 0) {
    do {
      local_70 = (undefined4)uncomprLen;
      local_78 = uncompr;
      uVar1 = inflate(&local_90,0);
    } while (uVar1 == 0);
    if (uVar1 == 1) {
      uVar1 = inflateEnd(&local_90);
      if (uVar1 == 0) {
        if (local_68 == (comprLen >> 1) + uncomprLen * 2) {
          puts("large_inflate(): OK");
          return;
        }
        fprintf(_stderr,"bad large inflate: %ld\n");
        goto LAB_00102c01;
      }
      pcVar2 = "inflateEnd";
    }
    else {
      pcVar2 = "large inflate";
    }
  }
  else {
    pcVar2 = "inflateInit";
  }
  fprintf(_stderr,"%s error: %d\n",pcVar2,(ulong)uVar1);
LAB_00102c01:
  exit(1);
}

Assistant:

void test_large_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    for (;;) {
        d_stream.next_out = uncompr;            /* discard the output */
        d_stream.avail_out = (uInt)uncomprLen;
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "large inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (d_stream.total_out != 2*uncomprLen + comprLen/2) {
        fprintf(stderr, "bad large inflate: %ld\n", d_stream.total_out);
        exit(1);
    } else {
        printf("large_inflate(): OK\n");
    }
}